

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

void Lms_ManStop(Lms_Man_t *p)

{
  word *__ptr;
  Vec_Wrd_t *__ptr_00;
  Vec_Mem_t *pVVar1;
  int i;
  long lVar2;
  
  Vec_IntFreeP(&p->vLabels);
  Vec_PtrFreeP(&p->vLabelsP);
  Vec_PtrFreeP(&p->vNodes);
  Vec_IntFreeP(&p->vTruthPo);
  __ptr_00 = p->vDelays;
  if (__ptr_00 != (Vec_Wrd_t *)0x0) {
    if (__ptr_00->pArray != (word *)0x0) {
      free(__ptr_00->pArray);
      p->vDelays->pArray = (word *)0x0;
      __ptr_00 = p->vDelays;
      if (__ptr_00 == (Vec_Wrd_t *)0x0) goto LAB_0025fe00;
    }
    free(__ptr_00);
    p->vDelays = (Vec_Wrd_t *)0x0;
  }
LAB_0025fe00:
  Vec_StrFreeP(&p->vAreas);
  Vec_IntFreeP(&p->vFreqs);
  Vec_IntFreeP(&p->vTruthFreqs);
  Vec_IntFreeP(&p->vTruthIds);
  pVVar1 = p->vTtMem;
  if (pVVar1 == (Vec_Mem_t *)0x0) {
    pVVar1 = (Vec_Mem_t *)0x0;
  }
  else {
    Vec_IntFreeP(&pVVar1->vTable);
    Vec_IntFreeP(&pVVar1->vNexts);
    pVVar1 = p->vTtMem;
  }
  for (lVar2 = 0; lVar2 <= pVVar1->iPage; lVar2 = lVar2 + 1) {
    __ptr = pVVar1->ppPages[lVar2];
    if (__ptr != (word *)0x0) {
      free(__ptr);
      pVVar1->ppPages[lVar2] = (word *)0x0;
    }
  }
  free(pVVar1->ppPages);
  free(pVVar1);
  Gia_ManStopP(&p->pGia);
  free(p);
  return;
}

Assistant:

void Lms_ManStop( Lms_Man_t * p )
{
    // temporaries
    Vec_IntFreeP( &p->vLabels );
    Vec_PtrFreeP( &p->vLabelsP );
    Vec_PtrFreeP( &p->vNodes );
    // internal data for AIG level minimization
    Vec_IntFreeP( &p->vTruthPo );
    Vec_WrdFreeP( &p->vDelays );
    Vec_StrFreeP( &p->vAreas );
    Vec_IntFreeP( &p->vFreqs );
    Vec_IntFreeP( &p->vTruthFreqs );
    // internal data for library construction
    Vec_IntFreeP( &p->vTruthIds );
    Vec_MemHashFree( p->vTtMem );
//    Vec_MemHashFree( p->vTtMem2 );
    Vec_MemFree( p->vTtMem );
//    Vec_MemFree( p->vTtMem2 );
    Gia_ManStopP( &p->pGia );
    ABC_FREE( p );
}